

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpsctl.c
# Opt level: O0

slReturn parseBool(void *ptrArg,int intArg,optionDef_slOptions *def,char *arg,
                  clientData_slOptions *clientData)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  slReturn pvVar4;
  clientData_slOptions *clientData_local;
  char *arg_local;
  optionDef_slOptions *def_local;
  int intArg_local;
  void *ptrArg_local;
  
  *(undefined4 *)ptrArg = 0;
  if (arg != (char *)0x0) {
    pcVar2 = strchr("yYtT1",(int)*arg);
    *(uint *)ptrArg = (uint)(pcVar2 != (char *)0x0);
    sVar3 = strlen(arg);
    if (((1 < sVar3) && (iVar1 = tolower((int)*arg), iVar1 == 0x6f)) &&
       (iVar1 = tolower((int)arg[1]), iVar1 == 0x6e)) {
      *(undefined4 *)ptrArg = 1;
    }
  }
  pvVar4 = makeOkReturn();
  return pvVar4;
}

Assistant:

static slReturn parseBool(void* ptrArg, int intArg, const optionDef_slOptions* def, const char* arg, clientData_slOptions* clientData) {

    // see if we've got anything that like a yes or true (otherwise, we make it a false)...
    *((int*)ptrArg) = 0;
    if (arg) {
        *((int*)ptrArg) = (strchr("yYtT1", *arg) != NULL ? 1 : 0);
        // now look for "on" and treat it as true
        if (strlen(arg) > 1) {
            if ((tolower(arg[0]) == 'o') && (tolower(arg[1]) == 'n')) {
                *((int*)ptrArg) = 1;
            }
        }
    }
    // then return with no error...
    return makeOkReturn();
}